

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::cast_float16_to_float32(Mat *src,Mat *dst,Option *opt)

{
  Layer *this;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ParamDict pd;
  Layer *cast;
  undefined8 in_stack_ffffffffffffffb8;
  ParamDict *this_00;
  ParamDict *in_stack_ffffffffffffffd0;
  
  this = create_layer((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  this_00 = (ParamDict *)&stack0xffffffffffffffd0;
  ParamDict::ParamDict(in_stack_ffffffffffffffd0);
  ParamDict::set(this_00,0,2);
  ParamDict::set((ParamDict *)&stack0xffffffffffffffd0,1,1);
  (*this->_vptr_Layer[2])(this,&stack0xffffffffffffffd0);
  (*this->_vptr_Layer[4])(this,in_RDX);
  (*this->_vptr_Layer[7])(this,in_RDI,in_RSI,in_RDX);
  (*this->_vptr_Layer[5])(this,in_RDX);
  if (this != (Layer *)0x0) {
    (*this->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict((ParamDict *)this);
  return;
}

Assistant:

void cast_float16_to_float32(const Mat& src, Mat& dst, const Option& opt)
{
    Layer* cast = create_layer(LayerType::Cast);

    ParamDict pd;
    pd.set(0, 2);
    pd.set(1, 1);

    cast->load_param(pd);

    cast->create_pipeline(opt);

    cast->forward(src, dst, opt);

    cast->destroy_pipeline(opt);

    delete cast;
}